

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::clearSequence(MidiFile *this,int track)

{
  pointer ppMVar1;
  ostream *poVar2;
  
  if ((-1 < track) &&
     (ppMVar1 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     track < (int)((ulong)((long)(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3)))
  {
    MidiEventList::clearSequence(ppMVar1[(uint)track]);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Warning: track ",0xf);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,track);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," does not exist.",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void MidiFile::clearSequence(int track) {
	if ((track >= 0) && (track < getTrackCount())) {
		operator[](track).clearSequence();
	} else {
		std::cerr << "Warning: track " << track << " does not exist." << std::endl;
	}
}